

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefile(cmGlobalUnixMakefileGenerator3 *this)

{
  cmLocalGenerator *pcVar1;
  bool bVar2;
  byte bVar3;
  cmake *pcVar4;
  string *psVar5;
  reference ppcVar6;
  ostream *poVar7;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar8;
  iterator iVar9;
  iterator iVar10;
  reference remote_path;
  cmMakefile *pcVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  reference remote_path_00;
  reference ppcVar13;
  string local_510;
  cmLocalGenerator *local_4f0;
  cmLocalGenerator *localGen_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1_3;
  string tmpStr;
  string *outfile;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  string binDir;
  string local_430;
  undefined1 local_410 [8];
  string check;
  string *f;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string currentBinDir;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_388;
  const_iterator local_380;
  const_iterator local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_370;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_368;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_360;
  iterator new_end;
  cmake *cm;
  cmLocalGenerator *localGen;
  iterator __end1;
  iterator __begin1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lfiles;
  cmLocalUnixMakefileGenerator3 *lg;
  string makefileName;
  undefined1 local_2b0 [8];
  cmGeneratedFileStream cmakefileStream;
  string cmakefileName;
  allocator<char> local_31;
  string local_30;
  cmGlobalUnixMakefileGenerator3 *local_10;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_SUPPRESS_REGENERATION",&local_31);
  bVar2 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  if (!bVar2) {
    pcVar4 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
    psVar5 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar4);
    std::__cxx11::string::string((string *)&cmakefileStream.field_0x240,(string *)psVar5);
    std::__cxx11::string::operator+=((string *)&cmakefileStream.field_0x240,"/CMakeFiles");
    std::__cxx11::string::operator+=((string *)&cmakefileStream.field_0x240,"/Makefile.cmake");
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_2b0,(string *)&cmakefileStream.field_0x240,false,None)
    ;
    bVar3 = std::ios::operator!((ios *)(local_2b0 + (long)*(_func_int **)((long)local_2b0 + -0x18)))
    ;
    if ((bVar3 & 1) == 0) {
      pcVar4 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
      psVar5 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar4);
      std::__cxx11::string::string((string *)&lg,(string *)psVar5);
      std::__cxx11::string::operator+=((string *)&lg,"/Makefile");
      ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                            LocalGenerators,0);
      cmLocalUnixMakefileGenerator3::WriteDisclaimer
                ((cmLocalUnixMakefileGenerator3 *)*ppcVar6,(ostream *)local_2b0);
      poVar7 = std::operator<<((ostream *)local_2b0,"# The generator used is:\n");
      poVar7 = std::operator<<(poVar7,"set(CMAKE_DEPENDS_GENERATOR \"");
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[3])
                (&lfiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar7 = std::operator<<(poVar7,(string *)
                                      &lfiles.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar7,"\")\n\n");
      std::__cxx11::string::~string
                ((string *)
                 &lfiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1);
      pvVar8 = &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators;
      __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(pvVar8);
      localGen = (cmLocalGenerator *)
                 std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(pvVar8);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                         *)&localGen), bVar2) {
        ppcVar13 = __gnu_cxx::
                   __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                   ::operator*(&__end1);
        pcVar11 = cmLocalGenerator::GetMakefile(*ppcVar13);
        pvVar12 = cmMakefile::GetListFiles_abi_cxx11_(pcVar11);
        cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1,pvVar12);
        __gnu_cxx::
        __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
        ::operator++(&__end1);
      }
      pcVar4 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
      bVar2 = cmake::DoWriteGlobVerifyTarget(pcVar4);
      if (bVar2) {
        psVar5 = cmake::GetGlobVerifyScript_abi_cxx11_(pcVar4);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1,psVar5);
        psVar5 = cmake::GetGlobVerifyStamp_abi_cxx11_(pcVar4);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1,psVar5);
      }
      iVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1);
      iVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
      std::
      sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                (iVar9._M_current,iVar10._M_current);
      local_368._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
      local_370 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range1);
      local_360 = std::
                  unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            (local_368,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_370);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_378,&local_360);
      local_388._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_380,&local_388);
      currentBinDir.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1,local_378,local_380);
      ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                            LocalGenerators,0);
      pcVar1 = *ppcVar6;
      psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar1);
      std::__cxx11::string::string((string *)&__range1_1,(string *)psVar5);
      poVar7 = std::operator<<((ostream *)local_2b0,
                               "# The top level Makefile was generated from the following files:\n")
      ;
      poVar7 = std::operator<<(poVar7,"set(CMAKE_MAKEFILE_DEPENDS\n");
      std::operator<<(poVar7,"  \"CMakeCache.txt\"\n");
      __end1_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range1);
      f = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&f), bVar2) {
        remote_path = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end1_1);
        poVar7 = std::operator<<((ostream *)local_2b0,"  \"");
        cmLocalGenerator::MaybeConvertToRelativePath
                  ((string *)((long)&check.field_2 + 8),pcVar1,(string *)&__range1_1,remote_path);
        poVar7 = std::operator<<(poVar7,(string *)(check.field_2._M_local_buf + 8));
        std::operator<<(poVar7,"\"\n");
        std::__cxx11::string::~string((string *)(check.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1_1);
      }
      std::operator<<((ostream *)local_2b0,"  )\n\n");
      pcVar4 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
      psVar5 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar4);
      std::__cxx11::string::string((string *)local_410,(string *)psVar5);
      std::__cxx11::string::operator+=((string *)local_410,"/CMakeFiles");
      std::__cxx11::string::operator+=((string *)local_410,"/cmake.check_cache");
      poVar7 = std::operator<<((ostream *)local_2b0,"# The corresponding makefile is:\n");
      poVar7 = std::operator<<(poVar7,"set(CMAKE_MAKEFILE_OUTPUTS\n");
      poVar7 = std::operator<<(poVar7,"  \"");
      cmLocalGenerator::MaybeConvertToRelativePath
                (&local_430,pcVar1,(string *)&__range1_1,(string *)&lg);
      poVar7 = std::operator<<(poVar7,(string *)&local_430);
      poVar7 = std::operator<<(poVar7,"\"\n");
      poVar7 = std::operator<<(poVar7,"  \"");
      cmLocalGenerator::MaybeConvertToRelativePath
                ((string *)((long)&binDir.field_2 + 8),pcVar1,(string *)&__range1_1,
                 (string *)local_410);
      poVar7 = std::operator<<(poVar7,(string *)(binDir.field_2._M_local_buf + 8));
      std::operator<<(poVar7,"\"\n");
      std::__cxx11::string::~string((string *)(binDir.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_430);
      std::operator<<((ostream *)local_2b0,"  )\n\n");
      psVar5 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar1);
      std::__cxx11::string::string((string *)&__range1_2,(string *)psVar5);
      poVar7 = std::operator<<((ostream *)local_2b0,"# Byproducts of CMake generate step:\n");
      std::operator<<(poVar7,"set(CMAKE_MAKEFILE_PRODUCTS\n");
      pcVar11 = cmLocalGenerator::GetMakefile(pcVar1);
      pvVar12 = cmMakefile::GetOutputFiles_abi_cxx11_(pcVar11);
      __end1_2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar12);
      outfile = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(pvVar12);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1_2,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&outfile), bVar2) {
        remote_path_00 =
             __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_2);
        poVar7 = std::operator<<((ostream *)local_2b0,"  \"");
        cmLocalGenerator::MaybeConvertToRelativePath
                  ((string *)((long)&tmpStr.field_2 + 8),pcVar1,(string *)&__range1_2,remote_path_00
                  );
        poVar7 = std::operator<<(poVar7,(string *)(tmpStr.field_2._M_local_buf + 8));
        std::operator<<(poVar7,"\"\n");
        std::__cxx11::string::~string((string *)(tmpStr.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1_2);
      }
      std::__cxx11::string::string((string *)&__range1_3);
      pvVar8 = &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators;
      __end1_3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(pvVar8)
      ;
      localGen_1 = (cmLocalGenerator *)
                   std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(pvVar8)
      ;
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1_3,
                                (__normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                 *)&localGen_1), bVar2) {
        ppcVar13 = __gnu_cxx::
                   __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                   ::operator*(&__end1_3);
        pcVar1 = *ppcVar13;
        local_4f0 = pcVar1;
        psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar1);
        std::__cxx11::string::operator=((string *)&__range1_3,(string *)psVar5);
        std::__cxx11::string::operator+=((string *)&__range1_3,"/CMakeFiles");
        std::__cxx11::string::operator+=((string *)&__range1_3,"/CMakeDirectoryInformation.cmake");
        poVar7 = std::operator<<((ostream *)local_2b0,"  \"");
        cmLocalGenerator::MaybeConvertToRelativePath
                  (&local_510,pcVar1,(string *)&__range1_2,(string *)&__range1_3);
        poVar7 = std::operator<<(poVar7,(string *)&local_510);
        std::operator<<(poVar7,"\"\n");
        std::__cxx11::string::~string((string *)&local_510);
        __gnu_cxx::
        __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
        ::operator++(&__end1_3);
      }
      std::operator<<((ostream *)local_2b0,"  )\n\n");
      std::__cxx11::string::~string((string *)&__range1_3);
      WriteMainCMakefileLanguageRules
                (this,(cmGeneratedFileStream *)local_2b0,
                 &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators);
      std::__cxx11::string::~string((string *)&__range1_2);
      std::__cxx11::string::~string((string *)local_410);
      std::__cxx11::string::~string((string *)&__range1_1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
      std::__cxx11::string::~string((string *)&lg);
      makefileName.field_2._12_4_ = 0;
    }
    else {
      makefileName.field_2._12_4_ = 1;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2b0);
    std::__cxx11::string::~string((string *)&cmakefileStream.field_0x240);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainCMakefile()
{
  if (this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    return;
  }

  // Open the output file.  This should not be copy-if-different
  // because the check-build-system step compares the makefile time to
  // see if the build system must be regenerated.
  std::string cmakefileName =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  cmakefileName += "/CMakeFiles";
  cmakefileName += "/Makefile.cmake";
  cmGeneratedFileStream cmakefileStream(cmakefileName);
  if (!cmakefileStream) {
    return;
  }

  std::string makefileName =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  makefileName += "/Makefile";

  // get a local generator for some useful methods
  cmLocalUnixMakefileGenerator3* lg =
    static_cast<cmLocalUnixMakefileGenerator3*>(this->LocalGenerators[0]);

  // Write the do not edit header.
  lg->WriteDisclaimer(cmakefileStream);

  // Save the generator name
  cmakefileStream << "# The generator used is:\n"
                  << "set(CMAKE_DEPENDS_GENERATOR \"" << this->GetName()
                  << "\")\n\n";

  // for each cmMakefile get its list of dependencies
  std::vector<std::string> lfiles;
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    // Get the list of files contributing to this generation step.
    cmAppend(lfiles, localGen->GetMakefile()->GetListFiles());
  }

  cmake* cm = this->GetCMakeInstance();
  if (cm->DoWriteGlobVerifyTarget()) {
    lfiles.push_back(cm->GetGlobVerifyScript());
    lfiles.push_back(cm->GetGlobVerifyStamp());
  }

  // Sort the list and remove duplicates.
  std::sort(lfiles.begin(), lfiles.end(), std::less<std::string>());
#if !defined(__VMS) // The Compaq STL on VMS crashes, so accept duplicates.
  std::vector<std::string>::iterator new_end =
    std::unique(lfiles.begin(), lfiles.end());
  lfiles.erase(new_end, lfiles.end());
#endif

  // reset lg to the first makefile
  lg = static_cast<cmLocalUnixMakefileGenerator3*>(this->LocalGenerators[0]);

  std::string currentBinDir = lg->GetCurrentBinaryDirectory();
  // Save the list to the cmake file.
  cmakefileStream
    << "# The top level Makefile was generated from the following files:\n"
    << "set(CMAKE_MAKEFILE_DEPENDS\n"
    << "  \"CMakeCache.txt\"\n";
  for (std::string const& f : lfiles) {
    cmakefileStream << "  \""
                    << lg->MaybeConvertToRelativePath(currentBinDir, f)
                    << "\"\n";
  }
  cmakefileStream << "  )\n\n";

  // Build the path to the cache check file.
  std::string check = this->GetCMakeInstance()->GetHomeOutputDirectory();
  check += "/CMakeFiles";
  check += "/cmake.check_cache";

  // Set the corresponding makefile in the cmake file.
  cmakefileStream << "# The corresponding makefile is:\n"
                  << "set(CMAKE_MAKEFILE_OUTPUTS\n"
                  << "  \""
                  << lg->MaybeConvertToRelativePath(currentBinDir,
                                                    makefileName)
                  << "\"\n"
                  << "  \""
                  << lg->MaybeConvertToRelativePath(currentBinDir, check)
                  << "\"\n";
  cmakefileStream << "  )\n\n";

  const std::string binDir = lg->GetBinaryDirectory();

  // CMake must rerun if a byproduct is missing.
  {
    cmakefileStream << "# Byproducts of CMake generate step:\n"
                    << "set(CMAKE_MAKEFILE_PRODUCTS\n";
    for (std::string const& outfile : lg->GetMakefile()->GetOutputFiles()) {
      cmakefileStream << "  \""
                      << lg->MaybeConvertToRelativePath(binDir, outfile)
                      << "\"\n";
    }

    // add in all the directory information files
    std::string tmpStr;
    for (cmLocalGenerator* localGen : this->LocalGenerators) {
      lg = static_cast<cmLocalUnixMakefileGenerator3*>(localGen);
      tmpStr = lg->GetCurrentBinaryDirectory();
      tmpStr += "/CMakeFiles";
      tmpStr += "/CMakeDirectoryInformation.cmake";
      cmakefileStream << "  \""
                      << lg->MaybeConvertToRelativePath(binDir, tmpStr)
                      << "\"\n";
    }
    cmakefileStream << "  )\n\n";
  }

  this->WriteMainCMakefileLanguageRules(cmakefileStream,
                                        this->LocalGenerators);
}